

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O0

nhdp_link * nhdp_db_link_add(nhdp_neighbor *neigh,nhdp_interface *param_2)

{
  list_entity **pplVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  uint64_t uVar4;
  nhdp_link *lnk;
  nhdp_interface *local_if_local;
  nhdp_neighbor *neigh_local;
  
  neigh_local = (nhdp_neighbor *)oonf_class_malloc(&_link_info);
  if ((nhdp_link *)neigh_local == (nhdp_link *)0x0) {
    neigh_local = (nhdp_neighbor *)0x0;
  }
  else {
    ((nhdp_link *)neigh_local)->local_if = param_2;
    plVar2 = &((nhdp_link *)neigh_local)->_if_node;
    plVar3 = (param_2->_links).prev;
    plVar2->next = &param_2->_links;
    (((nhdp_link *)neigh_local)->_if_node).prev = plVar3;
    (param_2->_links).prev = plVar2;
    plVar3->next = plVar2;
    plVar2 = &((nhdp_link *)neigh_local)->_neigh_node;
    plVar3 = (neigh->_links).prev;
    plVar2->next = &neigh->_links;
    (((nhdp_link *)neigh_local)->_neigh_node).prev = plVar3;
    (neigh->_links).prev = plVar2;
    plVar3->next = plVar2;
    ((nhdp_link *)neigh_local)->neigh = neigh;
    plVar3 = &((nhdp_link *)neigh_local)->_global_node;
    plVar3->next = &_link_list;
    (((nhdp_link *)neigh_local)->_global_node).prev = _link_list.prev;
    pplVar1 = &(_link_list.prev)->next;
    _link_list.prev = plVar3;
    *pplVar1 = plVar3;
    avl_init(&((nhdp_link *)neigh_local)->_addresses,avl_comp_netaddr,0);
    avl_init(&((nhdp_link *)neigh_local)->_2hop,avl_comp_netaddr,0);
    (((nhdp_link *)neigh_local)->sym_time).class = &_link_symtime_info;
    (((nhdp_link *)neigh_local)->heard_time).class = &_link_heard_info;
    (((nhdp_link *)neigh_local)->vtime).class = &_link_vtime_info;
    (((nhdp_link *)neigh_local)->_originator_node).key = neigh;
    if ((neigh->originator)._type != '\0') {
      avl_insert(&param_2->_link_originators,&((nhdp_link *)neigh_local)->_originator_node);
    }
    uVar4 = oonf_clock_getNow();
    ((nhdp_link *)neigh_local)->last_status_change = uVar4;
    nhdp_domain_init_link((nhdp_link *)neigh_local);
    oonf_class_event(&_link_info,neigh_local,OONF_OBJECT_ADDED);
  }
  return (nhdp_link *)neigh_local;
}

Assistant:

struct nhdp_link *
nhdp_db_link_add(struct nhdp_neighbor *neigh, struct nhdp_interface *local_if) {
  struct nhdp_link *lnk;

  lnk = oonf_class_malloc(&_link_info);
  if (lnk == NULL) {
    return NULL;
  }

  /* hook into interface */
  nhdp_interface_add_link(local_if, lnk);

  /* hook into neighbor */
  list_add_tail(&neigh->_links, &lnk->_neigh_node);
  lnk->neigh = neigh;

  /* hook into global list */
  list_add_tail(&_link_list, &lnk->_global_node);

  /* init local trees */
  avl_init(&lnk->_addresses, avl_comp_netaddr, false);
  avl_init(&lnk->_2hop, avl_comp_netaddr, false);

  /* init timers */
  lnk->sym_time.class = &_link_symtime_info;
  lnk->heard_time.class = &_link_heard_info;
  lnk->vtime.class = &_link_vtime_info;

  /* add to originator tree if set */
  lnk->_originator_node.key = &neigh->originator;
  if (netaddr_get_address_family(&neigh->originator) != AF_UNSPEC) {
    avl_insert(&local_if->_link_originators, &lnk->_originator_node);
  }

  lnk->last_status_change = oonf_clock_getNow();

  /* initialize link domain data */
  nhdp_domain_init_link(lnk);

  /* trigger event */
  oonf_class_event(&_link_info, lnk, OONF_OBJECT_ADDED);

  return lnk;
}